

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

upb_MiniTable * upb_MiniTable_GetSubMessageTable(upb_MiniTable *m,upb_MiniTableField *f)

{
  byte bVar1;
  upb_MiniTable *puVar2;
  upb_MiniTable *puVar3;
  
  bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
    if ((ulong)(bVar1 - 1) - 9 < 2) {
      if ((f->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
        if ((ulong)(bVar1 - 1) - 9 < 2) {
          puVar3 = *m->subs_dont_copy_me__upb_internal_use_only
                    [f->submsg_index_dont_copy_me__upb_internal_use_only].
                    submsg_dont_copy_me__upb_internal_use_only;
        }
        else {
          puVar3 = (upb_MiniTable *)0x0;
        }
      }
      else {
        puVar3 = (upb_MiniTable *)0x0;
        if ((bVar1 != 5) && (puVar3 = (upb_MiniTable *)0x0, bVar1 != 0xc)) goto LAB_0012acc8;
      }
      if (puVar3 == (upb_MiniTable *)0x0) {
        __assert_fail("ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/message.h"
                      ,0x84,
                      "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
                     );
      }
      puVar2 = (upb_MiniTable *)0x0;
      if (puVar3 != &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only) {
        puVar2 = puVar3;
      }
      return puVar2;
    }
  }
  else if ((bVar1 != 5) && (bVar1 != 0xc)) {
LAB_0012acc8:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/field.h"
                  ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
  }
  __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_table/internal/message.h"
                ,0x82,
                "const struct upb_MiniTable *upb_MiniTable_GetSubMessageTable(const struct upb_MiniTable *, const struct upb_MiniTableField *)"
               );
}

Assistant:

UPB_API_INLINE const struct upb_MiniTable* upb_MiniTable_GetSubMessageTable(
    const struct upb_MiniTable* m, const struct upb_MiniTableField* f) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  const struct upb_MiniTable* ret = upb_MiniTable_SubMessage(m, f);
  UPB_ASSUME(ret);
  return UPB_PRIVATE(_upb_MiniTable_IsEmpty)(ret) ? NULL : ret;
}